

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardsurface.h
# Opt level: O3

void __thiscall rengine::StandardSurface::onRender(StandardSurface *this)

{
  int iVar1;
  Renderer *pRVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Renderer *pRVar3;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_Surface).m_impl)->_vptr_SurfaceBackendImpl[4])();
  if ((char)iVar1 != '\0') {
    pRVar3 = (this->m_renderer)._M_t.
             super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
             super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
             super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
    if (pRVar3 == (Renderer *)0x0) {
      iVar1 = (*((this->super_Surface).m_impl)->_vptr_SurfaceBackendImpl[9])();
      pRVar2 = (Renderer *)CONCAT44(extraout_var,iVar1);
      pRVar3 = (this->m_renderer)._M_t.
               super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>.
               _M_t.
               super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
               super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
      (this->m_renderer)._M_t.
      super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
      super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
      super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl = pRVar2;
      if (pRVar3 != (Renderer *)0x0) {
        (*pRVar3->_vptr_Renderer[1])();
        pRVar2 = (this->m_renderer)._M_t.
                 super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>
                 .super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
      }
      iVar1 = (*(this->super_Surface)._vptr_Surface[4])(this);
      pRVar2->m_sceneRoot = (Node *)CONCAT44(extraout_var_00,iVar1);
      pRVar3 = (this->m_renderer)._M_t.
               super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>.
               _M_t.
               super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
               super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
    }
    iVar1 = (*(this->super_Surface)._vptr_Surface[5])(this,pRVar3->m_sceneRoot);
    pRVar3->m_sceneRoot = (Node *)CONCAT44(extraout_var_01,iVar1);
    if (((this->m_renderer)._M_t.
         super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
         super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
         super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl)->m_sceneRoot != (Node *)0x0
       ) {
      AnimationManager::tick(&this->m_animationManager);
      (*(this->super_Surface)._vptr_Surface[6])(this);
      (*((this->m_renderer)._M_t.
         super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
         super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
         super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl)->_vptr_Renderer[4])();
      (*(this->super_Surface)._vptr_Surface[7])(this);
      (*((this->super_Surface).m_impl)->_vptr_SurfaceBackendImpl[5])();
      (*((this->m_renderer)._M_t.
         super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
         super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
         super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl)->_vptr_Renderer[6])();
      if (((this->m_animationManager).m_runningAnimations.
           super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
           ._M_impl._M_node.super__List_node_base._M_next !=
           (_List_node_base *)&(this->m_animationManager).m_runningAnimations) ||
         ((this->m_animationManager).m_scheduledAnimations.
          super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
          ._M_impl._M_node.super__List_node_base._M_next !=
          (_List_node_base *)&(this->m_animationManager).m_scheduledAnimations)) {
        (*((this->super_Surface).m_impl)->_vptr_SurfaceBackendImpl[8])();
        return;
      }
    }
  }
  return;
}

Assistant:

void onRender() override {
        if (!beginRender())
            return;

        // Initialize the renderer if this is the first time around
        if (!m_renderer) {
            m_renderer.reset(createRenderer());
            m_renderer->setSceneRoot(build());
        }

        // Update the scene graph...
        m_renderer->setSceneRoot(update(m_renderer->sceneRoot()));

        if (!m_renderer->sceneRoot())
            return;

        // Advance the animations just before rendering..
        m_animationManager.tick();

        // And then render the stuff
        onBeforeRender();
        m_renderer->render();
        onAfterRender();

        commitRender();
        m_renderer->frameSwapped();

        // Schedule a repaint again if there are animations running...

        // ### TODO: Optimize waiting for scheduled animations. Rather than
        // just keep on rendering, we should figure out how long we need to
        // wait and schedule an update at that time.
        if (m_animationManager.animationsRunning() || m_animationManager.animationsScheduled()) {
            requestRender();
        }
    }